

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::LongStressCaseInternal::Texture::setWrap(Texture *this,deUint32 s,deUint32 t)

{
  deUint32 dVar1;
  deUint32 t_local;
  deUint32 s_local;
  Texture *this_local;
  
  dVar1 = getGLBindTarget(this);
  glwBindTexture(dVar1,this->m_textureGL);
  dVar1 = getGLBindTarget(this);
  glwTexParameteri(dVar1,0x2802,s);
  dVar1 = getGLBindTarget(this);
  glwTexParameteri(dVar1,0x2803,t);
  return;
}

Assistant:

void Texture::setWrap (const deUint32 s, const deUint32 t) const
{
	glBindTexture(getGLBindTarget(), m_textureGL);
	glTexParameteri(getGLBindTarget(), GL_TEXTURE_WRAP_S, s);
	glTexParameteri(getGLBindTarget(), GL_TEXTURE_WRAP_T, t);
}